

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFModulusPoly.cpp
# Opt level: O2

ModulusPoly * __thiscall
ZXing::Pdf417::ModulusPoly::negative(ModulusPoly *__return_storage_ptr__,ModulusPoly *this)

{
  int iVar1;
  ModulusGF *field;
  pointer piVar2;
  size_t i;
  size_type sVar3;
  int iVar4;
  int iVar5;
  size_type __n;
  vector<int,_std::allocator<int>_> negativeCoefficients;
  allocator_type local_39;
  _Vector_base<int,_std::allocator<int>_> local_38;
  
  __n = (long)(this->_coefficients).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(this->_coefficients).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start >> 2;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_38,__n,&local_39);
  field = this->_field;
  piVar2 = (this->_coefficients).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (sVar3 = 0; __n != sVar3; sVar3 = sVar3 + 1) {
    iVar4 = piVar2[sVar3];
    iVar1 = field->_modulus;
    iVar5 = iVar1 - iVar4;
    iVar4 = -iVar4;
    if (iVar5 < iVar1) {
      iVar4 = iVar5;
    }
    local_38._M_impl.super__Vector_impl_data._M_start[sVar3] = iVar4;
  }
  ModulusPoly(__return_storage_ptr__,field,(vector<int,_std::allocator<int>_> *)&local_38);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_38);
  return __return_storage_ptr__;
}

Assistant:

ModulusPoly
ModulusPoly::negative() const
{
	size_t size = _coefficients.size();
	std::vector<int> negativeCoefficients(size);
	for (size_t i = 0; i < size; i++) {
		negativeCoefficients[i] = _field->subtract(0, _coefficients[i]);
	}
	return ModulusPoly(*_field, negativeCoefficients);
}